

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<unsigned_int,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,uint value,FormatSpec spec)

{
  undefined4 uVar1;
  uint uVar2;
  lconv *plVar3;
  size_t sVar4;
  CharPtr pwVar5;
  ulong uVar6;
  byte bVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar13;
  
  uVar1 = spec._20_4_;
  uVar9 = (ulong)value;
  uVar13 = 0;
  uVar10 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar7 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar7 = 0x20;
    }
    uVar13 = (uint)bVar7;
    uVar10 = 1;
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_0010dd13;
      if (spec.type_ != 'B') goto code_r0x0010de85;
    }
    else {
      if (spec.type_ == 'X') {
LAB_0010dca1:
        uVar13 = uVar10;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffc4)[uVar10] = 0x30;
          uVar13 = uVar10 | 2;
          (&stack0xffffffffffffffc5)[uVar10] = spec.type_;
        }
        uVar10 = 0;
        uVar6 = uVar9;
        do {
          uVar10 = uVar10 + 1;
          uVar2 = (uint)uVar6;
          uVar6 = uVar6 >> 4;
        } while (0xf < uVar2);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar10,&spec,&stack0xffffffffffffffc4,uVar13);
        pcVar8 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar8 = "0123456789abcdef";
        }
        do {
          uVar10 = (uint)uVar9;
          *pwVar5 = (int)pcVar8[uVar10 & 0xf];
          pwVar5 = pwVar5 + -1;
          uVar9 = uVar9 >> 4;
        } while (0xf < uVar10);
        return;
      }
      if (spec.type_ != 'b') goto code_r0x0010de85;
    }
    uVar13 = uVar10;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      (&stack0xffffffffffffffc4)[uVar10] = 0x30;
      uVar13 = uVar10 | 2;
      (&stack0xffffffffffffffc5)[uVar10] = spec.type_;
    }
    uVar10 = 0;
    uVar6 = uVar9;
    do {
      uVar10 = uVar10 + 1;
      uVar2 = (uint)uVar6;
      uVar6 = uVar6 >> 1;
    } while (1 < uVar2);
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>(this,uVar10,&spec,&stack0xffffffffffffffc4,uVar13);
    do {
      uVar10 = (uint)uVar9;
      *pwVar5 = uVar10 & 1 | 0x30;
      pwVar5 = pwVar5 + -1;
      uVar9 = uVar9 >> 1;
    } while (1 < uVar10);
  }
  else {
    if (0x6e < (byte)spec.type_) {
      if (spec.type_ == 'o') {
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar6 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          (&stack0xffffffffffffffc4)[uVar6] = 0x30;
        }
        uVar13 = 0;
        uVar6 = uVar9;
        do {
          uVar13 = uVar13 + 1;
          uVar2 = (uint)uVar6;
          uVar6 = uVar6 >> 3;
        } while (7 < uVar2);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar13,&spec,&stack0xffffffffffffffc4,uVar10);
        do {
          uVar10 = (uint)uVar9;
          *pwVar5 = uVar10 & 7 | 0x30;
          pwVar5 = pwVar5 + -1;
          uVar9 = uVar9 >> 3;
        } while (7 < uVar10);
        return;
      }
      if (spec.type_ == 'x') goto LAB_0010dca1;
code_r0x0010de85:
      internal::report_unknown_type
                (in_stack_ffffffffffffffbf,(char *)CONCAT44(uVar13,in_stack_ffffffffffffffc0));
    }
    if (spec.type_ != 'd') {
      if (spec.type_ == 'n') {
        uVar13 = 0x1f;
        if ((value | 1) != 0) {
          for (; (value | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = (uVar13 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
        plVar3 = localeconv();
        pcVar8 = plVar3->thousands_sep;
        sVar4 = strlen(pcVar8);
        uVar13 = uVar13 - (value < internal::BasicData<void>::POWERS_OF_10_32[uVar13]);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar13 + (int)sVar4 * (uVar13 / 3) + 1,&spec,
                            &stack0xffffffffffffffc4,uVar10);
        pwVar5 = pwVar5 + 1;
        uVar10 = 0;
        if (99 < value) {
          do {
            uVar2 = uVar10;
            uVar13 = (uint)uVar9;
            value = (uint)(uVar9 / 100);
            uVar6 = (ulong)((uVar13 + (int)(uVar9 / 100) * -100) * 2);
            pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [uVar6 + 1];
            pwVar5 = pwVar5 + -1;
            if (((uVar2 | 1) * -0x55555555 < 0x55555556) &&
               (pwVar5 = pwVar5 + -sVar4, 0 < (long)sVar4)) {
              lVar11 = 0;
              lVar12 = sVar4 + 1;
              do {
                pwVar5[lVar11] = (int)pcVar8[lVar11];
                lVar12 = lVar12 + -1;
                lVar11 = lVar11 + 1;
              } while (1 < lVar12);
            }
            pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [uVar6];
            pwVar5 = pwVar5 + -1;
            if (((uVar2 + 2) * -0x55555555 < 0x55555556) &&
               (pwVar5 = pwVar5 + -sVar4, 0 < (long)sVar4)) {
              lVar11 = 0;
              lVar12 = sVar4 + 1;
              do {
                pwVar5[lVar11] = (int)pcVar8[lVar11];
                lVar12 = lVar12 + -1;
                lVar11 = lVar11 + 1;
              } while (1 < lVar12);
            }
            uVar9 = uVar9 / 100;
            uVar10 = uVar2 + 2;
          } while (9999 < uVar13);
          uVar10 = (uint)(uVar2 * -0x55555555 + 1 < 0x55555556);
        }
        if (value < 10) {
          pwVar5[-1] = value | 0x30;
          return;
        }
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [((ulong)value * 2 & 0xffffffff) + 1];
        pwVar5 = pwVar5 + -1;
        if (((char)uVar10 != '\0') && (pwVar5 = pwVar5 + -sVar4, 0 < (long)sVar4)) {
          lVar11 = sVar4 + 1;
          lVar12 = 0;
          do {
            pwVar5[lVar12] = (int)pcVar8[lVar12];
            lVar11 = lVar11 + -1;
            lVar12 = lVar12 + 1;
          } while (1 < lVar11);
        }
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(ulong)value * 2];
        return;
      }
      goto code_r0x0010de85;
    }
LAB_0010dd13:
    uVar13 = 0x1f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = (uVar13 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar13 - (value < internal::BasicData<void>::POWERS_OF_10_32[uVar13]))
                             + 1,&spec,&stack0xffffffffffffffc4,uVar10);
    pwVar5 = pwVar5 + 1;
    if (99 < value) {
      do {
        uVar10 = (uint)uVar9;
        value = (uint)(uVar9 / 100);
        uVar9 = uVar9 / 100;
        uVar6 = (ulong)(uVar10 + (int)uVar9 * -100);
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar6 * 2 + 1];
        pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar6 * 2];
        pwVar5 = pwVar5 + -2;
      } while (9999 < uVar10);
    }
    if (value < 10) {
      pwVar5[-1] = value | 0x30;
    }
    else {
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [((ulong)value * 2 & 0xffffffff) + 1];
      pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(ulong)value * 2];
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}